

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__process_gif_raster(stbi__context *s,stbi__gif *g)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long in_RSI;
  stbi__int32 code;
  stbi__gif_lzw *p;
  stbi__int32 clear;
  stbi__int32 valid_bits;
  stbi__int32 bits;
  stbi__int32 oldcode;
  stbi__int32 avail;
  stbi__int32 codemask;
  stbi__int32 codesize;
  stbi__uint32 first;
  stbi__int32 init_code;
  stbi__int32 len;
  stbi_uc lzw_cs;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  stbi__context *in_stack_ffffffffffffffb0;
  int local_40;
  uint local_3c;
  uint local_38;
  int local_24;
  uint local_20;
  
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (0xc < bVar3) {
    return (stbi_uc *)0x0;
  }
  uVar6 = 1 << (bVar3 & 0x1f);
  bVar2 = true;
  iVar7 = bVar3 + 1;
  uVar8 = (1 << ((byte)iVar7 & 0x1f)) - 1;
  local_3c = 0;
  local_40 = 0;
  for (local_24 = 0; local_24 < (int)uVar6; local_24 = local_24 + 1) {
    *(undefined2 *)(in_RSI + 0x834 + (long)local_24 * 4) = 0xffff;
    *(char *)(in_RSI + 0x836 + (long)local_24 * 4) = (char)local_24;
    *(char *)(in_RSI + 0x837 + (long)local_24 * 4) = (char)local_24;
  }
  uVar9 = uVar6 + 2;
  local_38 = 0xffffffff;
  local_20 = 0;
  while( true ) {
    while( true ) {
      for (; local_40 < iVar7; local_40 = local_40 + 8) {
        if (local_20 == 0) {
          bVar4 = stbi__get8((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          local_20 = (uint)bVar4;
          if (local_20 == 0) {
            return *(stbi_uc **)(in_RSI + 8);
          }
        }
        local_20 = local_20 - 1;
        bVar4 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        local_3c = (uint)bVar4 << ((byte)local_40 & 0x1f) | local_3c;
      }
      in_stack_ffffffffffffffac = local_3c & uVar8;
      local_3c = (int)local_3c >> ((byte)iVar7 & 0x1f);
      local_40 = local_40 - iVar7;
      if (in_stack_ffffffffffffffac != uVar6) break;
      iVar7 = bVar3 + 1;
      uVar8 = (1 << ((byte)iVar7 & 0x1f)) - 1;
      uVar9 = uVar6 + 2;
      local_38 = 0xffffffff;
      bVar2 = false;
    }
    if (in_stack_ffffffffffffffac == uVar6 + 1) {
      stbi__skip(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      while (sVar5 = stbi__get8((stbi__context *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
            sVar5 != '\0') {
        stbi__skip(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      return *(stbi_uc **)(in_RSI + 8);
    }
    if ((int)uVar9 < (int)in_stack_ffffffffffffffac) break;
    if (bVar2) {
      stbi__err((char *)in_stack_ffffffffffffffb0);
      return (stbi_uc *)0x0;
    }
    if ((int)local_38 < 0) {
      if (in_stack_ffffffffffffffac == uVar9) {
        stbi__err((char *)in_stack_ffffffffffffffb0);
        return (stbi_uc *)0x0;
      }
    }
    else {
      uVar10 = uVar9 + 1;
      in_stack_ffffffffffffffb0 = (stbi__context *)(in_RSI + 0x834 + (long)(int)uVar9 * 4);
      if (0x2000 < (int)uVar10) {
        stbi__err((char *)in_stack_ffffffffffffffb0);
        return (stbi_uc *)0x0;
      }
      *(short *)&in_stack_ffffffffffffffb0->img_x = (short)local_38;
      *(char *)((long)&in_stack_ffffffffffffffb0->img_x + 2) =
           *(char *)(in_RSI + 0x836 + (long)(int)local_38 * 4);
      if (in_stack_ffffffffffffffac == uVar10) {
        cVar1 = *(char *)((long)&in_stack_ffffffffffffffb0->img_x + 2);
      }
      else {
        cVar1 = *(char *)(in_RSI + 0x836 + (long)(int)in_stack_ffffffffffffffac * 4);
      }
      in_stack_ffffffffffffffa8 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffa8);
      *(char *)((long)&in_stack_ffffffffffffffb0->img_x + 3) = cVar1;
      uVar9 = uVar10;
    }
    stbi__out_gif_code((stbi__gif *)CONCAT44(iVar7,uVar8),(stbi__uint16)(uVar9 >> 0x10));
    local_38 = in_stack_ffffffffffffffac;
    if (((uVar9 & uVar8) == 0) && ((int)uVar9 < 0x1000)) {
      iVar7 = iVar7 + 1;
      uVar8 = (1 << ((byte)iVar7 & 0x1f)) - 1;
    }
  }
  stbi__err((char *)in_stack_ffffffffffffffb0);
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__process_gif_raster(stbi__context *s, stbi__gif *g)
{
   stbi_uc lzw_cs;
   stbi__int32 len, init_code;
   stbi__uint32 first;
   stbi__int32 codesize, codemask, avail, oldcode, bits, valid_bits, clear;
   stbi__gif_lzw *p;

   lzw_cs = stbi__get8(s);
   if (lzw_cs > 12) return NULL;
   clear = 1 << lzw_cs;
   first = 1;
   codesize = lzw_cs + 1;
   codemask = (1 << codesize) - 1;
   bits = 0;
   valid_bits = 0;
   for (init_code = 0; init_code < clear; init_code++) {
      g->codes[init_code].prefix = -1;
      g->codes[init_code].first = (stbi_uc) init_code;
      g->codes[init_code].suffix = (stbi_uc) init_code;
   }

   // support no starting clear code
   avail = clear+2;
   oldcode = -1;

   len = 0;
   for(;;) {
      if (valid_bits < codesize) {
         if (len == 0) {
            len = stbi__get8(s); // start new block
            if (len == 0)
               return g->out;
         }
         --len;
         bits |= (stbi__int32) stbi__get8(s) << valid_bits;
         valid_bits += 8;
      } else {
         stbi__int32 code = bits & codemask;
         bits >>= codesize;
         valid_bits -= codesize;
         // @OPTIMIZE: is there some way we can accelerate the non-clear path?
         if (code == clear) {  // clear code
            codesize = lzw_cs + 1;
            codemask = (1 << codesize) - 1;
            avail = clear + 2;
            oldcode = -1;
            first = 0;
         } else if (code == clear + 1) { // end of stream code
            stbi__skip(s, len);
            while ((len = stbi__get8(s)) > 0)
               stbi__skip(s,len);
            return g->out;
         } else if (code <= avail) {
            if (first) {
               return stbi__errpuc("no clear code", "Corrupt GIF");
            }

            if (oldcode >= 0) {
               p = &g->codes[avail++];
               if (avail > 8192) {
                  return stbi__errpuc("too many codes", "Corrupt GIF");
               }

               p->prefix = (stbi__int16) oldcode;
               p->first = g->codes[oldcode].first;
               p->suffix = (code == avail) ? p->first : g->codes[code].first;
            } else if (code == avail)
               return stbi__errpuc("illegal code in raster", "Corrupt GIF");

            stbi__out_gif_code(g, (stbi__uint16) code);

            if ((avail & codemask) == 0 && avail <= 0x0FFF) {
               codesize++;
               codemask = (1 << codesize) - 1;
            }

            oldcode = code;
         } else {
            return stbi__errpuc("illegal code in raster", "Corrupt GIF");
         }
      }
   }
}